

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::reportAabbOverlappingNodex
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  cbtTraversalMode cVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 local_10;
  ushort local_c;
  undefined4 local_8;
  ushort local_4;
  
  if (this->m_useQuantization == true) {
    fVar1 = (this->m_bvhAabbMin).m_floats[2];
    fVar2 = (this->m_bvhQuantization).m_floats[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(this->m_bvhAabbMin).m_floats;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(this->m_bvhAabbMax).m_floats;
    uVar3 = *(undefined8 *)(this->m_bvhQuantization).m_floats;
    auVar16._8_2_ = 0xfffe;
    auVar16._0_8_ = 0xfffefffefffefffe;
    auVar16._10_2_ = 0xfffe;
    auVar16._12_2_ = 0xfffe;
    auVar16._14_2_ = 0xfffe;
    auVar7 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)aabbMin->m_floats[2]));
    auVar8 = ZEXT416((uint)(this->m_bvhAabbMax).m_floats[2]);
    auVar7 = vminss_avx(auVar8,auVar7);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)aabbMin->m_floats;
    local_4 = (ushort)(int)((auVar7._0_4_ - fVar1) * fVar2) & 0xfffe;
    auVar7 = vmaxps_avx(auVar14,auVar11);
    auVar7 = vminps_avx(auVar15,auVar7);
    auVar7 = vsubps_avx(auVar7,auVar14);
    fVar5 = (float)uVar3;
    fVar6 = (float)((ulong)uVar3 >> 0x20);
    auVar12._0_4_ = (int)(auVar7._0_4_ * fVar5);
    auVar12._4_4_ = (int)(auVar7._4_4_ * fVar6);
    auVar12._8_4_ = (int)(auVar7._8_4_ * 0.0);
    auVar12._12_4_ = (int)(auVar7._12_4_ * 0.0);
    auVar7 = vpshuflw_avx(auVar12,0xe8);
    auVar7 = vpand_avx(auVar7,auVar16);
    local_8 = auVar7._0_4_;
    auVar7 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)aabbMax->m_floats[2]));
    auVar7 = vminss_avx(auVar8,auVar7);
    auVar13._8_2_ = 1;
    auVar13._0_8_ = 0x1000100010001;
    auVar13._10_2_ = 1;
    auVar13._12_2_ = 1;
    auVar13._14_2_ = 1;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)aabbMax->m_floats;
    local_c = (ushort)(int)(fVar2 * (auVar7._0_4_ - fVar1) + 1.0) | 1;
    auVar7 = vmaxps_avx(auVar14,auVar8);
    auVar7 = vminps_avx(auVar15,auVar7);
    auVar7 = vsubps_avx(auVar7,auVar14);
    auVar9._0_4_ = fVar5 * auVar7._0_4_;
    auVar9._4_4_ = fVar6 * auVar7._4_4_;
    auVar9._8_4_ = auVar7._8_4_ * 0.0;
    auVar9._12_4_ = auVar7._12_4_ * 0.0;
    auVar7._8_4_ = 0x3f800000;
    auVar7._0_8_ = 0x3f8000003f800000;
    auVar7._12_4_ = 0x3f800000;
    auVar7 = vaddps_avx512vl(auVar9,auVar7);
    auVar10._0_4_ = (int)auVar7._0_4_;
    auVar10._4_4_ = (int)auVar7._4_4_;
    auVar10._8_4_ = (int)auVar7._8_4_;
    auVar10._12_4_ = (int)auVar7._12_4_;
    auVar7 = vpshuflw_avx(auVar10,0xe8);
    auVar7 = vpor_avx(auVar7,auVar13);
    local_10 = auVar7._0_4_;
    cVar4 = this->m_traversalMode;
    if (cVar4 == TRAVERSAL_RECURSIVE) {
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (this,(this->m_quantizedContiguousNodes).m_data,nodeCallback,
                 (unsigned_short *)&local_8,(unsigned_short *)&local_10);
    }
    else if (cVar4 == TRAVERSAL_STACKLESS_CACHE_FRIENDLY) {
      walkStacklessQuantizedTreeCacheFriendly
                (this,nodeCallback,(unsigned_short *)&local_8,(unsigned_short *)&local_10);
    }
    else if (cVar4 == TRAVERSAL_STACKLESS) {
      walkStacklessQuantizedTree
                (this,nodeCallback,(unsigned_short *)&local_8,(unsigned_short *)&local_10,0,
                 this->m_curNodeIndex);
    }
    return;
  }
  walkStacklessTree(this,nodeCallback,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtQuantizedBvh::reportAabbOverlappingNodex(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	//either choose recursive traversal (walkTree) or stackless (walkStacklessTree)

	if (m_useQuantization)
	{
		///quantize query AABB
		unsigned short int quantizedQueryAabbMin[3];
		unsigned short int quantizedQueryAabbMax[3];
		quantizeWithClamp(quantizedQueryAabbMin, aabbMin, 0);
		quantizeWithClamp(quantizedQueryAabbMax, aabbMax, 1);

		switch (m_traversalMode)
		{
			case TRAVERSAL_STACKLESS:
				walkStacklessQuantizedTree(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax, 0, m_curNodeIndex);
				break;
			case TRAVERSAL_STACKLESS_CACHE_FRIENDLY:
				walkStacklessQuantizedTreeCacheFriendly(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
				break;
			case TRAVERSAL_RECURSIVE:
			{
				const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[0];
				walkRecursiveQuantizedTreeAgainstQueryAabb(rootNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
			}
			break;
			default:
				//unsupported
				cbtAssert(0);
		}
	}
	else
	{
		walkStacklessTree(nodeCallback, aabbMin, aabbMax);
	}
}